

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_7acd3c::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,double value,double total,string *status)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long val;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_b8;
  cmAlphaNum local_98;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  size_type local_58;
  pointer local_50;
  undefined8 local_48;
  char *local_40;
  size_t local_38;
  char *pcStack_30;
  undefined8 local_28;
  char *local_20;
  
  if (0.0 < total) {
    lVar1 = this->CurrentPercentage;
    lVar3 = lround((value / total) * 100.0);
    val = 100;
    if (lVar3 < 100) {
      val = lVar3;
    }
    this->CurrentPercentage = val;
    if (lVar1 == val) {
      bVar2 = false;
    }
    else {
      local_50 = (this->Text)._M_dataplus._M_p;
      local_58 = (this->Text)._M_string_length;
      local_68._M_len = 1;
      local_68._M_str = "[";
      local_48 = 1;
      local_40 = " ";
      cmAlphaNum::cmAlphaNum(&local_98,val);
      local_38 = local_98.View_._M_len;
      pcStack_30 = local_98.View_._M_str;
      local_28 = 0xb;
      local_20 = "% complete]";
      views._M_len = 5;
      views._M_array = &local_68;
      cmCatViews_abi_cxx11_(&local_b8,views);
      std::__cxx11::string::operator=((string *)status,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      bVar2 = true;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool UpdatePercentage(double value, double total, std::string& status)
  {
    long OldPercentage = this->CurrentPercentage;

    if (total > 0.0) {
      this->CurrentPercentage = std::lround(value / total * 100.0);
      if (this->CurrentPercentage > 100) {
        // Avoid extra progress reports for unexpected data beyond total.
        this->CurrentPercentage = 100;
      }
    }

    bool updated = (OldPercentage != this->CurrentPercentage);

    if (updated) {
      status =
        cmStrCat("[", this->Text, " ", this->CurrentPercentage, "% complete]");
    }

    return updated;
  }